

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hal_m2vd_vdpu1.c
# Opt level: O2

MPP_RET hal_m2vd_vdpu1_wait(void *hal,HalTaskInfo *task)

{
  long lVar1;
  MPP_RET MVar2;
  
  lVar1 = *(long *)((long)hal + 0x68);
  MVar2 = mpp_dev_ioctl(*(MppDev *)((long)hal + 0x90),0x10,(void *)0x0);
  if (MVar2 != MPP_OK) {
    _mpp_log_l(2,"hal_m2vd_vdpu1","poll cmd failed %d\n","hal_m2vd_vdpu1_wait",(ulong)(uint)MVar2);
  }
  if (((*(ushort *)(lVar1 + 5) & 0x140) != 0) &&
     (*(MppCbCtx **)((long)hal + 0x88) != (MppCbCtx *)0x0)) {
    mpp_callback_f("hal_m2vd_vdpu1_wait",*(MppCbCtx **)((long)hal + 0x88),(void *)0x0);
  }
  return MVar2;
}

Assistant:

MPP_RET hal_m2vd_vdpu1_wait(void *hal, HalTaskInfo *task)
{
    MPP_RET ret = MPP_OK;
    M2vdHalCtx *ctx = (M2vdHalCtx *)hal;
    M2vdVdpu1Reg_t* reg_out = (M2vdVdpu1Reg_t * )ctx->regs;

    ret = mpp_dev_ioctl(ctx->dev, MPP_DEV_CMD_POLL, NULL);
    if (ret)
        mpp_err_f("poll cmd failed %d\n", ret);

    if (reg_out->sw01.dec_error_int | reg_out->sw01.dec_buffer_int) {
        if (ctx->dec_cb)
            mpp_callback(ctx->dec_cb, NULL);
    }

    (void)task;

    return ret;
}